

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::RegularExpression::matchChar
          (RegularExpression *this,Context *context,XMLInt32 ch,XMLSize_t *offset,bool ignoreCase)

{
  bool bVar1;
  bool local_49;
  XMLInt32 local_38;
  bool match;
  XMLInt32 strCh;
  bool ignoreCase_local;
  XMLSize_t *offset_local;
  Context *pCStack_20;
  XMLInt32 ch_local;
  Context *context_local;
  RegularExpression *this_local;
  
  if (*offset < context->fLimit) {
    local_38 = 0;
    match = ignoreCase;
    _strCh = offset;
    offset_local._4_4_ = ch;
    pCStack_20 = context;
    context_local = (Context *)this;
    bVar1 = Context::nextCh(context,&local_38,offset);
    if (bVar1) {
      if ((match & 1U) == 0) {
        local_49 = offset_local._4_4_ == local_38;
      }
      else {
        local_49 = matchIgnoreCase(this,offset_local._4_4_,local_38);
      }
      if (local_49 == false) {
        this_local._7_1_ = false;
      }
      else {
        *_strCh = *_strCh + 1;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RegularExpression::matchChar(Context* const context,
                                  const XMLInt32 ch, XMLSize_t& offset,
                                  const bool ignoreCase) const
{
    if (offset >= context->fLimit)
        return false;

    XMLInt32 strCh = 0;

    if (!context->nextCh(strCh, offset))
        return false;

    bool match = ignoreCase ? matchIgnoreCase(ch, strCh)
                            : (ch == strCh);
    if (!match)
        return false;

    ++offset;

    return true;
}